

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinFenceOffset::emulate_mthd(MthdKelvinFenceOffset *this)

{
  int iVar1;
  MthdKelvinFenceOffset *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.card_type < 0x40) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_fence_offset =
           (this->super_SingleMthdTest).super_MthdTest.val;
    }
    else {
      iVar1 = pgraph_3d_class(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
      if (iVar1 < 6) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_fence_offset =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_fence_offset &
             0xff000000 | (this->super_SingleMthdTest).super_MthdTest.val & 0xffffff;
      }
      else {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_fence_offset =
             (this->super_SingleMthdTest).super_MthdTest.val;
      }
    }
    pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x43,0,
                  (this->super_SingleMthdTest).super_MthdTest.val,true);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		if (!exp.nsource) {
			if (chipset.card_type < 0x40)
				exp.bundle_fence_offset = val;
			else {
				if (pgraph_3d_class(&exp) < PGRAPH_3D_CURIE)
					insrt(exp.bundle_fence_offset, 0, 24, val);
				else
					exp.bundle_fence_offset = val;
			}
			pgraph_bundle(&exp, BUNDLE_FENCE_OFFSET, 0, val, true);
		}
	}